

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfonticonengine.cpp
# Opt level: O2

QString * __thiscall QFontIconEngine::key(QString *__return_storage_ptr__,QFontIconEngine *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_c8;
  QArrayDataPointer<char16_t> local_b0;
  QStringBuilder<QString,_QString> local_98;
  QStringBuilder<QStringBuilder<QString,_QString>,_char16_t> local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"QFontIconEngine(",0x10);
  QFont::key((QString *)&QStack_c8,&this->m_iconFont);
  QStringBuilder<QString,_QString>::QStringBuilder
            (&local_98,(QString *)&local_b0,(QString *)&QStack_c8);
  QStringBuilder<QString,_QString>::QStringBuilder(&local_68.a,&local_98);
  local_68.b = L')';
  QStringBuilder<QStringBuilder<QString,_QString>,_char16_t>::convertTo<QString>
            (__return_storage_ptr__,&local_68);
  QStringBuilder<QString,_QString>::~QStringBuilder(&local_68.a);
  QStringBuilder<QString,_QString>::~QStringBuilder(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFontIconEngine::key() const
{
    return u"QFontIconEngine("_s + m_iconFont.key() + u')';
}